

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O2

int x509_name_canon(X509_NAME *a)

{
  uchar **out;
  ASN1_STRING *dst;
  ASN1_STRING *str;
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  OPENSSL_STACK *sk;
  undefined8 *puVar5;
  OPENSSL_STACK *sk_00;
  X509_NAME_ENTRY *a_00;
  ASN1_OBJECT *pAVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  uchar *puVar11;
  ulong i;
  byte *pbVar12;
  int local_64;
  uchar *p;
  
  if (a->canon_enc != (uchar *)0x0) {
    OPENSSL_free(a->canon_enc);
    a->canon_enc = (uchar *)0x0;
  }
  sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)a->entries);
  if (sVar4 == 0) {
    a->canon_enclen = 0;
    iVar2 = 1;
  }
  else {
    sk = OPENSSL_sk_new_null();
    if (sk == (OPENSSL_STACK *)0x0) {
      iVar2 = 0;
    }
    else {
      local_64 = -1;
      sk_00 = (OPENSSL_STACK *)0x0;
      i = 0;
      do {
        sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)a->entries);
        if (sVar4 <= i) {
          iVar2 = 0;
          uVar1 = i2d_name_canon((stack_st_STACK_OF_X509_NAME_ENTRY *)sk,(uchar **)0x0);
          if (-1 < (int)uVar1) {
            a->canon_enclen = uVar1;
            p = (uchar *)OPENSSL_malloc((ulong)uVar1);
            if (p != (uchar *)0x0) {
              a->canon_enc = p;
              i2d_name_canon((stack_st_STACK_OF_X509_NAME_ENTRY *)sk,&p);
              iVar2 = 1;
            }
          }
          goto LAB_0026b7dd;
        }
        puVar5 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)a->entries,i);
        if (*(int *)(puVar5 + 2) != local_64) {
          sk_00 = OPENSSL_sk_new_null();
          iVar2 = 0;
          if (sk_00 == (OPENSSL_STACK *)0x0) goto LAB_0026b7dd;
          sVar4 = OPENSSL_sk_push(sk,sk_00);
          if (sVar4 == 0) {
            OPENSSL_sk_free(sk_00);
            iVar2 = 0;
            goto LAB_0026b7dd;
          }
          local_64 = *(int *)(puVar5 + 2);
        }
        a_00 = X509_NAME_ENTRY_new();
        iVar2 = 0;
        if (a_00 == (X509_NAME_ENTRY *)0x0) goto LAB_0026b7dd;
        pAVar6 = OBJ_dup((ASN1_OBJECT *)*puVar5);
        a_00->object = pAVar6;
        dst = a_00->value;
        str = (ASN1_STRING *)puVar5[1];
        uVar7 = ASN1_tag2bit(str->type);
        if ((uVar7 & 0x2956) == 0) {
          iVar2 = ASN1_STRING_copy(dst,str);
          if (iVar2 == 0) break;
        }
        else {
          dst->type = 0xc;
          out = &dst->data;
          uVar1 = ASN1_STRING_to_UTF8(out,str);
          dst->length = uVar1;
          if (uVar1 == 0xffffffff) break;
          pbVar12 = *out;
          uVar8 = (int)uVar1 >> 0x1f & uVar1;
          pbVar10 = pbVar12 + -1;
          while ((uVar9 = uVar8, 0 < (int)uVar1 &&
                 (iVar2 = OPENSSL_isspace((uint)*pbVar12), uVar9 = uVar1, iVar2 != 0))) {
            pbVar12 = pbVar12 + 1;
            uVar1 = uVar1 - 1;
            pbVar10 = pbVar10 + 1;
          }
          uVar1 = (int)uVar9 >> 0x1f & uVar9;
          pbVar10 = pbVar10 + (int)uVar9;
          while ((uVar8 = uVar1, 0 < (int)uVar9 &&
                 (iVar2 = OPENSSL_isspace((uint)*pbVar10), uVar8 = uVar9, iVar2 != 0))) {
            uVar9 = uVar9 - 1;
            pbVar10 = pbVar10 + -1;
          }
          puVar11 = *out;
          iVar2 = 0;
          while (iVar2 < (int)uVar8) {
            iVar3 = OPENSSL_isspace((uint)*pbVar12);
            if (iVar3 == 0) {
              iVar3 = OPENSSL_tolower((uint)*pbVar12);
              *puVar11 = (uchar)iVar3;
              pbVar12 = pbVar12 + 1;
              iVar2 = iVar2 + 1;
            }
            else {
              *puVar11 = ' ';
              do {
                iVar2 = iVar2 + 1;
                pbVar10 = pbVar12 + 1;
                pbVar12 = pbVar12 + 1;
                iVar3 = OPENSSL_isspace((uint)*pbVar10);
              } while (iVar3 != 0);
            }
            puVar11 = puVar11 + 1;
          }
          dst->length = (int)puVar11 - *(int *)&dst->data;
        }
        sVar4 = OPENSSL_sk_push(sk_00,a_00);
        i = i + 1;
      } while (sVar4 != 0);
      X509_NAME_ENTRY_free(a_00);
      iVar2 = 0;
LAB_0026b7dd:
      sk_STACK_OF_X509_NAME_ENTRY_pop_free
                ((stack_st_STACK_OF_X509_NAME_ENTRY *)sk,local_sk_X509_NAME_ENTRY_pop_free);
    }
  }
  return iVar2;
}

Assistant:

static int x509_name_canon(X509_NAME *a) {
  unsigned char *p;
  STACK_OF(STACK_OF_X509_NAME_ENTRY) *intname = NULL;
  STACK_OF(X509_NAME_ENTRY) *entries = NULL;
  X509_NAME_ENTRY *entry, *tmpentry = NULL;
  int set = -1, ret = 0, len;
  size_t i;

  if (a->canon_enc) {
    OPENSSL_free(a->canon_enc);
    a->canon_enc = NULL;
  }
  // Special case: empty X509_NAME => null encoding
  if (sk_X509_NAME_ENTRY_num(a->entries) == 0) {
    a->canon_enclen = 0;
    return 1;
  }
  intname = sk_STACK_OF_X509_NAME_ENTRY_new_null();
  if (!intname) {
    goto err;
  }
  for (i = 0; i < sk_X509_NAME_ENTRY_num(a->entries); i++) {
    entry = sk_X509_NAME_ENTRY_value(a->entries, i);
    if (entry->set != set) {
      entries = sk_X509_NAME_ENTRY_new_null();
      if (!entries) {
        goto err;
      }
      if (!sk_STACK_OF_X509_NAME_ENTRY_push(intname, entries)) {
        sk_X509_NAME_ENTRY_free(entries);
        goto err;
      }
      set = entry->set;
    }
    tmpentry = X509_NAME_ENTRY_new();
    if (tmpentry == NULL) {
      goto err;
    }
    tmpentry->object = OBJ_dup(entry->object);
    if (!asn1_string_canon(tmpentry->value, entry->value)) {
      goto err;
    }
    if (!sk_X509_NAME_ENTRY_push(entries, tmpentry)) {
      goto err;
    }
    tmpentry = NULL;
  }

  // Finally generate encoding

  len = i2d_name_canon(intname, NULL);
  if (len < 0) {
    goto err;
  }
  a->canon_enclen = len;

  p = reinterpret_cast<uint8_t *>(OPENSSL_malloc(a->canon_enclen));

  if (!p) {
    goto err;
  }

  a->canon_enc = p;

  i2d_name_canon(intname, &p);

  ret = 1;

err:

  if (tmpentry) {
    X509_NAME_ENTRY_free(tmpentry);
  }
  if (intname) {
    sk_STACK_OF_X509_NAME_ENTRY_pop_free(intname,
                                         local_sk_X509_NAME_ENTRY_pop_free);
  }
  return ret;
}